

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O2

void __thiscall
QRhiGles2::registerUniformIfActive
          (QRhiGles2 *this,BlockVariable *var,QByteArray *namePrefix,int binding,int baseOffset,
          GLuint program,ActiveUniformLocationTracker *activeUniformLocations,
          QGles2UniformDescriptionVector *dst)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_88;
  undefined1 local_70 [12];
  int iStack_64;
  undefined8 uStack_60;
  QStringBuilder<const_QByteArray_&,_const_QByteArray_&> local_58;
  undefined4 uStack_48;
  undefined4 local_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (var->type == Struct) {
    local_58.a._0_4_ = 2;
    local_58.a._4_4_ = 0;
    local_58.b._0_4_ = 0;
    local_58.b._4_4_ = 0;
    uStack_48 = 0;
    local_44 = 0;
    local_40 = "default";
    pcVar4 = (var->name).d.ptr;
    if (pcVar4 == (char *)0x0) {
      pcVar4 = (char *)&QByteArray::_empty;
    }
    QMessageLogger::warning
              ((char *)&local_58,"Nested structs are not supported at the moment. \'%s\' ignored.",
               pcVar4);
  }
  else {
    stack0xffffffffffffff98 = &DAT_aaaaaaaaaaaaaaaa;
    uStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_88.ptr = &DAT_aaaaaaaaaaaaaaaa;
    local_70._0_4_ = var->type;
    local_58.a = namePrefix;
    local_58.b = &var->name;
    QStringBuilder<const_QByteArray_&,_const_QByteArray_&>::convertTo<QByteArray>
              ((QByteArray *)&local_88,&local_58);
    pcVar4 = local_88.ptr;
    if (local_88.ptr == (char *)0x0) {
      pcVar4 = (char *)&QByteArray::_empty;
    }
    local_70._4_4_ =
         (*(((this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).
           functions[0x5e])((ulong)program,pcVar4);
    if (-1 < (int)local_70._4_4_) {
      bVar2 = QDuplicateTracker<int,_32UL>::hasSeen(activeUniformLocations,(int *)(local_70 + 4));
      if (!bVar2) {
        uVar1 = (var->arrayDims).d.size;
        if (uVar1 < 2) {
          stack0xffffffffffffff98 = (undefined1 *)CONCAT44(baseOffset + var->offset,binding);
          if (uVar1 == 0) {
            iVar3 = 0;
          }
          else {
            iVar3 = *(var->arrayDims).d.ptr;
          }
          uStack_60 = (undefined1 *)CONCAT44(iVar3,var->size);
          QVarLengthArray<QGles2UniformDescription,_8LL>::append
                    (dst,(QGles2UniformDescription *)local_70);
        }
        else {
          local_58.a._0_4_ = 2;
          local_58.a._4_4_ = 0;
          local_58.b._0_4_ = 0;
          local_58.b._4_4_ = 0;
          uStack_48 = 0;
          local_44 = 0;
          local_40 = "default";
          pcVar4 = (var->name).d.ptr;
          if (pcVar4 == (char *)0x0) {
            pcVar4 = (char *)&QByteArray::_empty;
          }
          QMessageLogger::warning
                    ((char *)&local_58,
                     "Array \'%s\' has more than one dimension. This is not supported.",pcVar4);
        }
      }
    }
    QArrayDataPointer<char>::~QArrayDataPointer(&local_88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRhiGles2::registerUniformIfActive(const QShaderDescription::BlockVariable &var,
                                        const QByteArray &namePrefix,
                                        int binding,
                                        int baseOffset,
                                        GLuint program,
                                        ActiveUniformLocationTracker *activeUniformLocations,
                                        QGles2UniformDescriptionVector *dst)
{
    if (var.type == QShaderDescription::Struct) {
        qWarning("Nested structs are not supported at the moment. '%s' ignored.",
                 var.name.constData());
        return;
    }
    QGles2UniformDescription uniform;
    uniform.type = var.type;
    const QByteArray name = namePrefix + var.name;
    // Here we expect that the OpenGL implementation has proper active uniform
    // handling, meaning that a uniform that is declared but not accessed
    // elsewhere in the code is reported as -1 when querying the location. If
    // that is not the case, it won't break anything, but we'll generate
    // unnecessary glUniform* calls then.
    uniform.glslLocation = f->glGetUniformLocation(program, name.constData());
    if (uniform.glslLocation >= 0 && !activeUniformLocations->hasSeen(uniform.glslLocation)) {
        if (var.arrayDims.size() > 1) {
            qWarning("Array '%s' has more than one dimension. This is not supported.",
                     var.name.constData());
            return;
        }
        uniform.binding = binding;
        uniform.offset = uint(baseOffset + var.offset);
        uniform.size = var.size;
        uniform.arrayDim = var.arrayDims.isEmpty() ? 0 : var.arrayDims.first();
        dst->append(uniform);
    }
}